

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBadTypeAttributes.cpp
# Opt level: O1

void (anonymous_namespace)::check<Imf_3_4::InputFile,Imf_3_4::OutputFile>
               (char *filename,string *inputtype,string *outputtype,bool add_tiledesc)

{
  size_t sVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  undefined4 *puVar5;
  undefined8 *puVar6;
  ostream *poVar7;
  OutputFile file;
  Header f;
  long *local_98;
  long local_90;
  long local_88 [2];
  undefined8 local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  Header local_58 [56];
  
  local_78 = 0;
  Imf_3_4::Header::Header(local_58,0x40,0x40,1.0,(Vec2 *)&local_78,1.0,INCREASING_Y,ZIP_COMPRESSION)
  ;
  pcVar4 = (char *)Imf_3_4::Header::channels();
  Imf_3_4::Channel::Channel((Channel *)&local_78,HALF,1,1,false);
  Imf_3_4::ChannelList::insert(pcVar4,(Channel *)"Dummy");
  sVar1 = *(size_t *)(filename + 8);
  if (sVar1 == DAT_001e8fb0) {
    if (sVar1 != 0) {
      iVar3 = bcmp(*(void **)filename,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,sVar1);
      if (iVar3 != 0) goto LAB_00130571;
    }
  }
  else {
LAB_00130571:
    Imf_3_4::Header::setType((string *)local_58);
  }
  puVar5 = (undefined4 *)Imf_3_4::Header::compression();
  *puVar5 = 2;
  remove("/var/tmp/badfile.exr");
  iVar3 = Imf_3_4::globalThreadCount();
  Imf_3_4::OutputFile::OutputFile((OutputFile *)&local_78,"/var/tmp/badfile.exr",local_58,iVar3);
  Imf_3_4::OutputFile::~OutputFile((OutputFile *)&local_78);
  iVar3 = Imf_3_4::globalThreadCount();
  Imf_3_4::MultiPartInputFile::MultiPartInputFile
            ((MultiPartInputFile *)&local_78,"/var/tmp/badfile.exr",iVar3,true);
  sVar1 = inputtype->_M_string_length;
  if (sVar1 == DAT_001e8fb0) {
    if (sVar1 != 0) {
      iVar3 = bcmp((inputtype->_M_dataplus)._M_p,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,sVar1);
      if (iVar3 != 0) goto LAB_0013060b;
    }
  }
  else {
LAB_0013060b:
    Imf_3_4::MultiPartInputFile::header((int)&local_78);
    puVar6 = (undefined8 *)Imf_3_4::Header::type_abi_cxx11_();
    sVar1 = puVar6[1];
    if (sVar1 == inputtype->_M_string_length) {
      if (sVar1 != 0) {
        iVar3 = bcmp((void *)*puVar6,(inputtype->_M_dataplus)._M_p,sVar1);
        if (iVar3 != 0) goto LAB_00130645;
      }
    }
    else {
LAB_00130645:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Error: expected type in header to be ",0x25);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(inputtype->_M_dataplus)._M_p,
                          inputtype->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," but got ",9);
      Imf_3_4::MultiPartInputFile::header((int)&local_78);
      puVar6 = (undefined8 *)Imf_3_4::Header::type_abi_cxx11_();
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)*puVar6,puVar6[1]);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7," from multipart when input type was ",0x24);
      sVar1 = *(size_t *)(filename + 8);
      if (sVar1 == DAT_001e8fb0) {
        if (sVar1 != 0) {
          iVar3 = bcmp(*(void **)filename,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,sVar1);
          if (iVar3 != 0) goto LAB_001306e9;
        }
        local_98 = local_88;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"unset","");
      }
      else {
LAB_001306e9:
        local_98 = local_88;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_98,*(long *)filename,sVar1 + *(long *)filename);
      }
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)local_98,local_90);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      if (local_98 != local_88) {
        operator_delete(local_98,local_88[0] + 1);
      }
    }
  }
  sVar1 = inputtype->_M_string_length;
  if (sVar1 == DAT_001e8fb0) {
    if (sVar1 != 0) {
      iVar3 = bcmp((inputtype->_M_dataplus)._M_p,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,sVar1);
      if (iVar3 != 0) goto LAB_0013079f;
    }
  }
  else {
LAB_0013079f:
    Imf_3_4::MultiPartInputFile::header((int)&local_78);
    puVar6 = (undefined8 *)Imf_3_4::Header::type_abi_cxx11_();
    sVar1 = puVar6[1];
    if (sVar1 != inputtype->_M_string_length) {
LAB_00130a59:
      __assert_fail("outputtype == NOTYPEATTR || file.header (0).type () == outputtype",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testBadTypeAttributes.cpp"
                    ,0x148,
                    "void (anonymous namespace)::check(const char *, const string &, const string &, bool) [IN = Imf_3_4::InputFile, OUT = Imf_3_4::OutputFile]"
                   );
    }
    if (sVar1 != 0) {
      iVar3 = bcmp((void *)*puVar6,(inputtype->_M_dataplus)._M_p,sVar1);
      if (iVar3 != 0) goto LAB_00130a59;
    }
  }
  if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
  }
  if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
  }
  iVar3 = Imf_3_4::globalThreadCount();
  Imf_3_4::InputFile::InputFile((InputFile *)&local_78,"/var/tmp/badfile.exr",iVar3);
  sVar1 = inputtype->_M_string_length;
  if (sVar1 == DAT_001e8fb0) {
    if (sVar1 != 0) {
      iVar3 = bcmp((inputtype->_M_dataplus)._M_p,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,sVar1);
      if (iVar3 != 0) goto LAB_0013083c;
    }
    Imf_3_4::InputFile::header();
    cVar2 = Imf_3_4::Header::hasType();
    if (cVar2 != '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr," type attribute got inserted when it shouldn\'t have been\n"
                 ,0x39);
    }
    Imf_3_4::InputFile::header();
    cVar2 = Imf_3_4::Header::hasType();
    if (cVar2 != '\0') {
      __assert_fail("!file.header ().hasType ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testBadTypeAttributes.cpp"
                    ,0x155,
                    "void (anonymous namespace)::check(const char *, const string &, const string &, bool) [IN = Imf_3_4::InputFile, OUT = Imf_3_4::OutputFile]"
                   );
    }
    goto LAB_00130a19;
  }
LAB_0013083c:
  Imf_3_4::InputFile::header();
  puVar6 = (undefined8 *)Imf_3_4::Header::type_abi_cxx11_();
  sVar1 = puVar6[1];
  if (sVar1 == inputtype->_M_string_length) {
    if (sVar1 == 0) goto LAB_00130a19;
    iVar3 = bcmp((void *)*puVar6,(inputtype->_M_dataplus)._M_p,sVar1);
    if (iVar3 == 0) goto LAB_00130a19;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Error: expected type in header to be ",0x25);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(inputtype->_M_dataplus)._M_p,
                      inputtype->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," but got ",9);
  Imf_3_4::InputFile::header();
  puVar6 = (undefined8 *)Imf_3_4::Header::type_abi_cxx11_();
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)*puVar6,puVar6[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," when input type was ",0x15);
  sVar1 = *(size_t *)(filename + 8);
  if (sVar1 == DAT_001e8fb0) {
    if (sVar1 != 0) {
      iVar3 = bcmp(*(void **)filename,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,sVar1);
      if (iVar3 != 0) goto LAB_0013091e;
    }
    local_98 = local_88;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"unset","");
  }
  else {
LAB_0013091e:
    local_98 = local_88;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,*(long *)filename,sVar1 + *(long *)filename);
  }
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)local_98,local_90);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
LAB_00130a19:
  if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
  }
  if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
  }
  remove("/var/tmp/badfile.exr");
  Imf_3_4::Header::~Header(local_58);
  return;
}

Assistant:

void
check (
    const char*   filename,
    const string& inputtype,
    const string& outputtype,
    bool          add_tiledesc)
{
    Header f;
    f.channels ().insert ("Dummy", Channel ());

    if (inputtype != NOTYPEATTR) { f.setType (inputtype); }
    f.compression () = ZIPS_COMPRESSION;
    if (add_tiledesc) { f.setTileDescription (TileDescription ()); }

    remove (filename);
    {
        OUT file (filename, f);
    }

    {
        MultiPartInputFile file (filename);

        if (outputtype != NOTYPEATTR && file.header (0).type () != outputtype)
        {
            cerr << "Error: expected type in header to be " << outputtype
                 << " but got " << file.header (0).type ()
                 << " from multipart when input type was "
                 << (inputtype == NOTYPEATTR ? "unset" : inputtype)
                 << std::endl;
        }

        assert (
            outputtype == NOTYPEATTR || file.header (0).type () == outputtype);
    }

    {
        IN file (filename);
        if (outputtype == NOTYPEATTR)
        {
            if (file.header ().hasType ())
            {
                cerr
                    << " type attribute got inserted when it shouldn't have been\n";
            }

            assert (!file.header ().hasType ());
        }
        else if (file.header ().type () != outputtype)
        {
            cerr << "Error: expected type in header to be " << outputtype
                 << " but got " << file.header ().type ()
                 << " when input type was "
                 << (inputtype == NOTYPEATTR ? "unset" : inputtype)
                 << std::endl;
        }
    }
    remove (filename);
}